

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O3

QDataStream * __thiscall QDataStream::operator<<(QDataStream *this,char *s)

{
  size_t sVar1;
  
  if (s == (char *)0x0) {
    if ((this->dev != (QIODevice *)0x0) && (this->q_status == '\0')) {
      operator<<(this,0);
    }
  }
  else {
    sVar1 = strlen(s);
    writeBytes(this,s,sVar1 + 1);
  }
  return this;
}

Assistant:

QDataStream &QDataStream::operator<<(const char *s)
{
    // Include null terminator, unless s itself is null
    const qint64 len = s ? qint64(qstrlen(s)) + 1 : 0;
    writeBytes(s, len);
    return *this;
}